

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void anon_unknown.dwarf_b73b25::FinalizeFeatureFormat
               (string *format,string *activeTag,string *otherTag)

{
  ulong uVar1;
  size_type pos;
  string *otherTag_local;
  string *activeTag_local;
  string *format_local;
  
  uVar1 = std::__cxx11::string::find((string *)format,(ulong)otherTag);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::find((char)format,0x7d);
    std::__cxx11::string::erase((ulong)format,uVar1);
  }
  uVar1 = std::__cxx11::string::find((string *)format,(ulong)activeTag);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)format,uVar1);
    uVar1 = std::__cxx11::string::find((char)format,0x7d);
    if (uVar1 != 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)format,uVar1);
    }
  }
  return;
}

Assistant:

void FinalizeFeatureFormat(std::string& format, const std::string& activeTag,
                           const std::string& otherTag)
{
  auto pos = format.find(otherTag);
  if (pos != std::string::npos) {
    format.erase(pos, format.find('}', pos) - pos + 1);
  }
  pos = format.find(activeTag);
  if (pos != std::string::npos) {
    format.erase(pos, activeTag.length());
    pos = format.find('}', pos);
    if (pos != std::string::npos) {
      format.erase(pos, 1);
    }
  }
}